

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

void __thiscall
Namespace<false>::AddFeature
          (Namespace<false> *this,feature_value v,feature_index i,char *feature_name)

{
  feature_index in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    features::push_back((features *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),
                        (feature_value)((ulong)in_RSI >> 0x20),in_RDX);
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  }
  return;
}

Assistant:

void AddFeature(feature_value v, feature_index i, const char* feature_name)
  {
    // filter out 0-values
    if (v == 0)
      return;

    ftrs->push_back(v, i);
    feature_count++;

    if (audit)
      ftrs->space_names.push_back(audit_strings_ptr(new audit_strings(name, feature_name)));
  }